

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O2

void pnga_print_distribution(int fstyle,Integer g_a)

{
  int iVar1;
  Integer IVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  Integer *dims_00;
  char *pcVar8;
  char *in_R8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  Integer ndim;
  ulong local_300;
  ulong local_2f8;
  int local_2ec;
  Integer hi [7];
  Integer lo [7];
  Integer index [7];
  Integer nblocks [7];
  char *name;
  Integer type;
  Integer proc_grid [7];
  Integer dims [7];
  char ctype [128];
  char msg [100];
  Integer proc_idx [7];
  
  local_300 = g_a;
  local_2f8 = pnga_nnodes();
  iVar1 = _ga_sync_end;
  bVar12 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar12) {
    pnga_sync();
  }
  IVar2 = pnga_nodeid();
  uVar10 = local_300;
  if (IVar2 != 0) goto LAB_00117f89;
  local_2ec = iVar1;
  dims_00 = dims;
  pnga_inquire(local_300,&type,&ndim,dims_00);
  pnga_inquire_name(uVar10,&name);
  printf("Array Handle=%d Name:\'%s\' ",uVar10 & 0xffffffff,name);
  printf("Data Type:");
  switch(type) {
  case 0x3e9:
    pcVar8 = "integer";
    break;
  case 0x3ea:
    pcVar8 = "long";
    break;
  case 0x3eb:
    pcVar8 = "float";
    break;
  case 0x3ec:
    pcVar8 = "double";
    break;
  default:
    pnga_error("ga_print_distribution: type not supported",type);
    goto LAB_00117d6d;
  case 0x3ee:
    pcVar8 = "float (single) complex";
    break;
  case 0x3ef:
    pcVar8 = "double complex";
    break;
  case 0x3f8:
    pcVar8 = "long long";
  }
  printf(pcVar8);
LAB_00117d6d:
  printf("\nArray Dimensions:");
  lVar11 = ndim;
  if (fstyle == 0) {
    for (; 1 < lVar11; lVar11 = lVar11 + -1) {
      printf("%ldx",dims[lVar11 + -1]);
    }
  }
  else {
    for (lVar11 = 0; lVar11 < ndim + -1; lVar11 = lVar11 + 1) {
      printf("%ldx",dims[lVar11]);
    }
    dims_00 = dims + ndim + -1;
  }
  printf("%ld\n",*dims_00);
  pnga_get_distribution_type(local_300,ctype);
  if (ctype._0_8_ == 0x72616c75676572) {
    uVar10 = local_2f8;
    if ((long)local_2f8 < 1) {
      uVar10 = 0;
    }
    for (uVar9 = 0; uVar9 != uVar10; uVar9 = uVar9 + 1) {
      pnga_distribution(local_300,uVar9,lo,hi);
      sprintf(msg,"Process=%d\t owns array section: ",uVar9 & 0xffffffff);
      if (fstyle == 0) {
        lVar11 = ndim / 2;
        if (lVar11 < 1) {
          lVar11 = 0;
        }
        lVar5 = ndim;
        for (lVar6 = 0; lVar5 = lVar5 + -1, lVar11 != lVar6; lVar6 = lVar6 + 1) {
          IVar2 = lo[lVar6];
          lo[lVar6] = lo[lVar5];
          lo[lVar5] = IVar2;
          IVar2 = hi[lVar6];
          in_R8 = (char *)hi[lVar5];
          hi[lVar6] = (Integer)in_R8;
          hi[lVar5] = IVar2;
        }
        lVar11 = 0;
        if (0 < ndim) {
          lVar11 = ndim;
        }
        for (lVar5 = 0; lVar11 != lVar5; lVar5 = lVar5 + 1) {
          lo[lVar5] = lo[lVar5] + -1;
        }
        for (lVar5 = 0; lVar11 != lVar5; lVar5 = lVar5 + 1) {
          hi[lVar5] = hi[lVar5] + -1;
        }
      }
      gai_print_range(msg,(int)ndim,lo,hi,in_R8);
    }
  }
  else {
    iVar1 = bcmp(ctype,"block_cyclic",0xd);
    if (iVar1 == 0) {
      pnga_nblock(local_300,nblocks);
      puts("\nDistribution is block-cyclic");
      lVar11 = 0;
      IVar2 = ndim;
      if (ndim < 1) {
        IVar2 = lVar11;
      }
      lVar5 = 1;
      for (; IVar2 != lVar11; lVar11 = lVar11 + 1) {
        lVar5 = lVar5 * nblocks[lVar11];
      }
      printf("\nTotal of %ld blocks on %ld processors\n",lVar5,local_2f8);
      for (uVar10 = 0; (long)uVar10 < (long)local_2f8; uVar10 = uVar10 + 1) {
        printf("Distribution on process %ld\n",uVar10);
        for (uVar9 = uVar10; (long)uVar9 < lVar5; uVar9 = uVar9 + local_2f8) {
          pnga_distribution(local_300,uVar9,lo,hi);
          sprintf(msg,"  Block=%d\t corresponds to array section: ",uVar9 & 0xffffffff);
          if (fstyle == 0) {
            lVar11 = ndim / 2;
            if (lVar11 < 1) {
              lVar11 = 0;
            }
            lVar6 = ndim;
            for (lVar7 = 0; lVar6 = lVar6 + -1, lVar11 != lVar7; lVar7 = lVar7 + 1) {
              IVar2 = lo[lVar7];
              lo[lVar7] = lo[lVar6];
              lo[lVar6] = IVar2;
              IVar2 = hi[lVar7];
              in_R8 = (char *)hi[lVar6];
              hi[lVar7] = (Integer)in_R8;
              hi[lVar6] = IVar2;
            }
            uVar10 = 0;
            if (0 < ndim) {
              uVar10 = ndim;
            }
            for (uVar3 = 0; uVar10 != uVar3; uVar3 = uVar3 + 1) {
              lo[uVar3] = lo[uVar3] + -1;
            }
            for (uVar3 = 0; uVar10 != uVar3; uVar3 = uVar3 + 1) {
              hi[uVar3] = hi[uVar3] + -1;
            }
          }
          gai_print_range(msg,(int)ndim,lo,hi,in_R8);
        }
      }
    }
    else {
      iVar1 = bcmp(ctype,"scalapack",10);
      if (((iVar1 == 0) || (iVar1 = bcmp(ctype,"tiled_irreg",0xc), iVar1 == 0)) ||
         (iVar1 = bcmp(ctype,"tiled",6), iVar1 == 0)) {
        pnga_nblock(local_300,nblocks);
        iVar1 = bcmp(ctype,"scalapack",10);
        if (iVar1 == 0) {
          pcVar8 = "\nDistribution is ScaLAPACK";
LAB_001181c6:
          puts(pcVar8);
        }
        else {
          iVar1 = bcmp(ctype,"tiled_irreg",0xc);
          if (iVar1 == 0) {
            pcVar8 = "\nDistribution is Tiled Irregular";
            goto LAB_001181c6;
          }
          iVar1 = bcmp(ctype,"tiled",6);
          if (iVar1 == 0) {
            pcVar8 = "\nDistribution is Tiled";
            goto LAB_001181c6;
          }
        }
        putchar(10);
        printf("Number of blocks in each dimension: [");
        for (lVar11 = 0; lVar11 < ndim + -1; lVar11 = lVar11 + 1) {
          printf("%ld,",nblocks[lVar11]);
        }
        printf("%ld]\n\n",nblocks[ndim + -1]);
        pnga_get_proc_grid(local_300,proc_grid);
        printf("Processor grid dimensions: [");
        for (lVar11 = 0; lVar11 < ndim + -1; lVar11 = lVar11 + 1) {
          printf("%ld,",proc_grid[lVar11]);
        }
        printf("%ld]\n\n",nblocks[ndim + -1]);
        for (lVar11 = 0; lVar11 < (long)local_2f8; lVar11 = lVar11 + 1) {
          printf("Distribution on process %ld\n",lVar11);
          uVar10 = local_300;
          pnga_get_proc_index(local_300,lVar11,proc_idx);
          pnga_get_proc_index(uVar10,lVar11,index);
          bVar12 = true;
          while (bVar12) {
            lVar5 = 0;
            for (IVar2 = ndim; 0 < IVar2; IVar2 = IVar2 + -1) {
              lVar5 = lVar5 * nblocks[IVar2 + -1] + index[IVar2 + -1];
            }
            sprintf(msg," idx: %ld Block=[",lVar5);
            pnga_distribution(local_300,lVar5,lo,hi);
            sVar4 = strlen(msg);
            pcVar8 = msg + sVar4;
            if (fstyle == 0) {
              uVar9 = ndim - 1;
              uVar10 = uVar9;
              while (0 < (long)uVar9) {
                sprintf(pcVar8,"%ld,",index[uVar10]);
                sVar4 = strlen(pcVar8);
                pcVar8 = pcVar8 + sVar4;
                uVar10 = uVar10 + 1;
              }
              sprintf(pcVar8,"%ld]",index[0]);
            }
            else {
              for (uVar10 = 0; (long)uVar10 < ndim + -1; uVar10 = uVar10 + 1) {
                sprintf(pcVar8,"%ld,",index[uVar10]);
                sVar4 = strlen(pcVar8);
                pcVar8 = pcVar8 + sVar4;
              }
              sprintf(pcVar8,"%ld]",index[ndim + -1]);
            }
            sVar4 = strlen(pcVar8);
            sprintf(pcVar8 + sVar4,"\t corresponds to array section: %d ",uVar10 & 0xffffffff);
            if (fstyle == 0) {
              lVar11 = ndim / 2;
              if (lVar11 < 1) {
                lVar11 = 0;
              }
              lVar5 = ndim;
              for (lVar6 = 0; lVar5 = lVar5 + -1, lVar11 != lVar6; lVar6 = lVar6 + 1) {
                IVar2 = lo[lVar6];
                lo[lVar6] = lo[lVar5];
                lo[lVar5] = IVar2;
                IVar2 = hi[lVar6];
                in_R8 = (char *)hi[lVar5];
                hi[lVar6] = (Integer)in_R8;
                hi[lVar5] = IVar2;
              }
              lVar11 = 0;
              if (0 < ndim) {
                lVar11 = ndim;
              }
              for (lVar5 = 0; lVar11 != lVar5; lVar5 = lVar5 + 1) {
                lo[lVar5] = lo[lVar5] + -1;
              }
              for (lVar5 = 0; lVar11 != lVar5; lVar5 = lVar5 + 1) {
                hi[lVar5] = hi[lVar5] + -1;
              }
            }
            gai_print_range(msg,(int)ndim,lo,hi,in_R8);
            index[0] = index[0] + proc_grid[0];
            lVar5 = 0;
            if (0 < ndim) {
              lVar5 = ndim;
            }
            lVar6 = 0;
            while (lVar6 != lVar5) {
              bVar12 = lVar6 < ndim + -1;
              in_R8 = (char *)CONCAT71((int7)((ulong)in_R8 >> 8),bVar12);
              if (index[lVar6] < nblocks[lVar6] || !bVar12) {
                lVar6 = lVar6 + 1;
              }
              else {
                index[lVar6] = proc_idx[lVar6];
                index[lVar6 + 1] = index[lVar6 + 1] + proc_grid[lVar6 + 1];
                lVar6 = lVar6 + 1;
              }
            }
            bVar12 = index[ndim + -1] < nblocks[ndim + -1];
          }
        }
      }
      else {
        puts("\nData distribution type is unknown");
      }
    }
  }
  fflush(_stdout);
  iVar1 = local_2ec;
LAB_00117f89:
  if (iVar1 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_print_distribution(int fstyle, Integer g_a)
{
Integer ndim, i, proc, type, nproc=pnga_nnodes();
Integer dims[MAXDIM], lo[MAXDIM], hi[MAXDIM];
char msg[100];
char ctype[128];
char *name;
int local_sync_begin,local_sync_end;

    local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if(local_sync_begin)pnga_sync();

    if(pnga_nodeid() ==0){
      pnga_inquire(g_a, &type, &ndim, dims);
      pnga_inquire_name(g_a, &name);
      printf("Array Handle=%d Name:'%s' ",(int)g_a, name);
      printf("Data Type:");
      switch(type){
        case C_DBL: printf("double"); break;
        case C_INT: printf("integer"); break;
        case C_DCPL: printf("double complex"); break;
        case C_SCPL: printf("float (single) complex"); break;
        case C_FLOAT: printf("float"); break; 
        case C_LONG: printf("long"); break; 
        case C_LONGLONG: printf("long long"); break; 
        default: pnga_error("ga_print_distribution: type not supported",type);
      }
      printf("\nArray Dimensions:");
      if(fstyle){
         for(i=0; i<ndim-1; i++)printf("%ldx",(long)dims[i]);
         printf("%ld\n",(long)dims[ndim-1]);
      }else{
         for(i=ndim-1; i>0; i--)printf("%ldx",(long)dims[i]);
         printf("%ld\n",(long)dims[0]);
      }

      /* print array range for every processor */
      
      pnga_get_distribution_type(g_a, ctype);
      if (!strcmp(ctype,"regular")) {
        for(proc = 0; proc < nproc; proc++){
          pnga_distribution(g_a,proc,lo,hi);
          sprintf(msg,"Process=%d\t owns array section: ",(int)proc);

          /* for C style need to swap and decremenent by 1 both arrays */
          if(!fstyle){
            for(i=0; i<ndim/2; i++){
              swap(lo+i,lo+ndim-i-1); 
              swap(hi+i,hi+ndim-i-1); 
            }
            for(i=0; i<ndim; i++)lo[i]--;
            for(i=0; i<ndim; i++)hi[i]--;
          }
          gai_print_range(msg,(int)ndim,lo,hi,"\n");
        }
      } else if (!strcmp(ctype,"block_cyclic")) {
        Integer nblocks[MAXDIM];
        Integer total, j;
        pnga_nblock(g_a,nblocks);
        printf("\nDistribution is block-cyclic\n");
        total = 1;
        for (i=0; i<ndim; i++) {
          total *= nblocks[i];
        }
        printf("\nTotal of %ld blocks on %ld processors\n",total,nproc);
        for (i=0; i<nproc; i++) {
          printf("Distribution on process %ld\n",i);
          for (j=i; j<total; j += nproc) {
            pnga_distribution(g_a,j,lo,hi);
            sprintf(msg,"  Block=%d\t corresponds to array section: ",(int)j);
            /* for C style need to swap and decremenent by 1 both arrays */
            if(!fstyle){
              for(i=0; i<ndim/2; i++){
                swap(lo+i,lo+ndim-i-1); 
                swap(hi+i,hi+ndim-i-1); 
              }
              for(i=0; i<ndim; i++)lo[i]--;
              for(i=0; i<ndim; i++)hi[i]--;
            }
            gai_print_range(msg,(int)ndim,lo,hi,"\n");
          }
        }
      } else if (!strcmp(ctype,"scalapack") ||
          !strcmp(ctype,"tiled_irreg") || !strcmp(ctype,"tiled")) {
        Integer nblocks[MAXDIM], proc_grid[MAXDIM], proc_idx[MAXDIM];
        Integer index[MAXDIM];
        Integer ok, j, idx;
        pnga_nblock(g_a,nblocks);
        char *ptr;
        if (!strcmp(ctype,"scalapack")) {
          printf("\nDistribution is ScaLAPACK\n");
        } else if (!strcmp(ctype,"tiled_irreg")) {
          printf("\nDistribution is Tiled Irregular\n");
        } else if (!strcmp(ctype,"tiled")) {
          printf("\nDistribution is Tiled\n");
        }

        printf("\n");
        printf("Number of blocks in each dimension: [");
        for (i=0; i<ndim-1; i++) printf("%ld,",nblocks[i]);
        printf("%ld]\n\n",nblocks[ndim-1]);

        pnga_get_proc_grid(g_a,proc_grid);
        printf("Processor grid dimensions: [");
        for (i=0; i<ndim-1; i++) printf("%ld,",proc_grid[i]);
        printf("%ld]\n\n",nblocks[ndim-1]);

        for (i=0; i<nproc; i++) {
          printf("Distribution on process %ld\n",i);
          pnga_get_proc_index(g_a,i,proc_idx);
          pnga_get_proc_index(g_a,i,index);
          ok = 1;
          while (ok) {
            /* find block index */
            idx = 0;
            for (j=ndim-1; j>=0; j--) {
              idx = idx*nblocks[j]+index[j];
            }
            sprintf(msg," idx: %ld Block=[",idx);
            pnga_distribution(g_a,idx,lo,hi);
            ptr = msg + strlen(msg);
            if (fstyle) {
              for (j=0; j<ndim-1; j++) {
                sprintf(ptr,"%ld,",index[j]);
                ptr += strlen(ptr);
              }
              sprintf(ptr,"%ld]",index[ndim-1]);
              ptr += strlen(ptr);
            } else {
              for (j=ndim-1; j>0; j++) {
                sprintf(ptr,"%ld,",index[j]);
                ptr += strlen(ptr);
              }
              sprintf(ptr,"%ld]",index[0]);
              ptr += strlen(ptr);
            }
            sprintf(ptr,"\t corresponds to array section: %d ",(int)j);
            /* for C style need to swap and decremenent by 1 both arrays */
            if(!fstyle){
              for(i=0; i<ndim/2; i++){
                swap(lo+i,lo+ndim-i-1); 
                swap(hi+i,hi+ndim-i-1); 
              }
              for(i=0; i<ndim; i++)lo[i]--;
              for(i=0; i<ndim; i++)hi[i]--;
            }
            gai_print_range(msg,(int)ndim,lo,hi,"\n");
            index[0] += proc_grid[0];
            for (j=0; j<ndim; j++) {
              if (index[j] >= nblocks[j] && j<ndim-1) {
                index[j] = proc_idx[j];
                index[j+1] += proc_grid[j+1];
              }
            }
            if (index[ndim-1] >= nblocks[ndim-1]) ok = 0;
          }
        }
      } else {
        printf("\nData distribution type is unknown\n");
      }
      fflush(stdout);
    }

    if(local_sync_end)pnga_sync();
}